

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O3

void __thiscall
KosarajuSCC::topological_sort
          (KosarajuSCC *this,int u,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *out,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *ends,queue<int,_std::deque<int,_std::allocator<int>_>_> *sort,
          vector<bool,_std::allocator<bool>_> *seen)

{
  ulong *puVar1;
  int *piVar2;
  bool bVar3;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar4;
  int iVar5;
  pointer pvVar6;
  int iVar7;
  ulong uVar8;
  pointer piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int local_54;
  ulong local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_48;
  KosarajuSCC *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  uVar8 = (ulong)u;
  iVar5 = u + 0x3f;
  if (-1 < u) {
    iVar5 = u;
  }
  puVar1 = (seen->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           (long)(iVar5 >> 6) +
           (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)u & 0x3f);
  pvVar6 = (out->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar9 = pvVar6[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_54 = u;
  local_40 = this;
  local_38 = out;
  if (*(pointer *)
       ((long)&pvVar6[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar9) {
    uVar12 = 0x800000000000003f;
    local_50 = 0x800000000000003f;
    uVar11 = 0;
    uVar10 = 1;
    local_48 = ends;
    do {
      pvVar4 = local_38;
      iVar5 = *(int *)(*(long *)&(ends->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[piVar9[uVar11]].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + 4);
      uVar11 = (ulong)iVar5;
      iVar7 = iVar5 + 0x3f;
      if (-1 < (long)uVar11) {
        iVar7 = iVar5;
      }
      if (((seen->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar7 >> 6) +
            (ulong)((uVar11 & uVar12) < 0x8000000000000001) + 0xffffffffffffffff] >> (uVar11 & 0x3f)
          & 1) == 0) {
        topological_sort(local_40,iVar5,local_38,ends,sort,seen);
        pvVar6 = (pvVar4->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        ends = local_48;
        uVar12 = local_50;
      }
      piVar9 = pvVar6[uVar8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar3 = uVar10 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar6[uVar8].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 8) - (long)piVar9 >> 2);
      uVar11 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  piVar2 = (sort->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur;
  if (piVar2 == (sort->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)sort,&local_54);
  }
  else {
    *piVar2 = u;
    (sort->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_cur = piVar2 + 1;
  }
  return;
}

Assistant:

void KosarajuSCC::topological_sort(int u, std::vector<std::vector<int> >& out,
																	 std::vector<std::vector<int> >& ends, std::queue<int>& sort,
																	 std::vector<bool>& seen) {
	seen[u] = true;
	for (unsigned int i = 0; i < out[u].size(); ++i) {
		const int e = out[u][i];
		const int v = ends[e][1];
		if (!seen[v]) {
			topological_sort(v, out, ends, sort, seen);
		}
	}
	sort.push(u);
}